

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_corpus.c
# Opt level: O0

int enum_corpus(lexicon_t *lex,model_def_t *mdef,uint32 *cnt,cnt_fn_t cnt_fn)

{
  acmod_set_t *acmod_set;
  uint32 n_phone_00;
  uint32 n_frame_00;
  uint16 *seg_00;
  int iVar1;
  char *pcVar2;
  acmod_id_t *phone_00;
  char *local_70;
  char *btw_mark;
  acmod_id_t *paStack_60;
  uint32 n_phone;
  acmod_id_t *phone;
  char **ppcStack_50;
  uint32 n_word;
  char **word;
  uint16 *puStack_40;
  int32 n_frame;
  uint16 *seg;
  char *trans;
  cnt_fn_t p_Stack_28;
  uint32 tick_cnt;
  cnt_fn_t cnt_fn_local;
  uint32 *cnt_local;
  model_def_t *mdef_local;
  lexicon_t *lex_local;
  
  trans._4_4_ = 0;
  seg = (uint16 *)0x0;
  puStack_40 = (uint16 *)0x0;
  ppcStack_50 = (char **)0x0;
  paStack_60 = (acmod_id_t *)0x0;
  local_70 = (char *)0x0;
  p_Stack_28 = cnt_fn;
  cnt_fn_local = (cnt_fn_t)cnt;
  cnt_local = (uint32 *)mdef;
  mdef_local = (model_def_t *)lex;
LAB_001026aa:
  while( true ) {
    iVar1 = corpus_next_utt();
    if (iVar1 == 0) {
      if (seg != (uint16 *)0x0) {
        free(seg);
        seg = (uint16 *)0x0;
      }
      if (puStack_40 != (uint16 *)0x0) {
        free(puStack_40);
        puStack_40 = (uint16 *)0x0;
      }
      if (ppcStack_50 != (char **)0x0) {
        ckd_free(ppcStack_50);
        ppcStack_50 = (char **)0x0;
      }
      if (paStack_60 != (acmod_id_t *)0x0) {
        ckd_free(paStack_60);
        paStack_60 = (acmod_id_t *)0x0;
      }
      if (local_70 != (char *)0x0) {
        ckd_free(local_70);
      }
      return 0;
    }
    if (seg != (uint16 *)0x0) {
      free(seg);
      seg = (uint16 *)0x0;
    }
    if (puStack_40 != (uint16 *)0x0) {
      free(puStack_40);
      puStack_40 = (uint16 *)0x0;
    }
    if (ppcStack_50 != (char **)0x0) {
      ckd_free(ppcStack_50);
      ppcStack_50 = (char **)0x0;
    }
    if (paStack_60 != (acmod_id_t *)0x0) {
      ckd_free(paStack_60);
      paStack_60 = (acmod_id_t *)0x0;
    }
    if (local_70 != (char *)0x0) {
      ckd_free(local_70);
      local_70 = (char *)0x0;
    }
    trans._4_4_ = trans._4_4_ + 1;
    if (trans._4_4_ % 1000 == 0) {
      fprintf(_stderr,"[%u] ",(ulong)trans._4_4_);
      fflush(_stderr);
    }
    iVar1 = corpus_get_sent((char **)&seg);
    if (iVar1 != 0) {
      pcVar2 = corpus_utt_brief_name();
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/param_cnt/enum_corpus.c"
              ,0x6a,"Unable to read word transcript for %s\n",pcVar2);
      exit(1);
    }
    if ((p_Stack_28 != phone_cnt) &&
       (iVar1 = corpus_get_seg(&stack0xffffffffffffffc0,(int32 *)((long)&word + 4)), iVar1 != 0)) {
      pcVar2 = corpus_utt_brief_name();
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/param_cnt/enum_corpus.c"
              ,0x70,"Unable to read Viterbi state segmentation for %s\n",pcVar2);
      exit(1);
    }
    phone._4_4_ = str2words((char *)seg,(char **)0x0,0);
    ppcStack_50 = (char **)__ckd_calloc__((ulong)phone._4_4_,8,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/param_cnt/enum_corpus.c"
                                          ,0x75);
    str2words((char *)seg,ppcStack_50,phone._4_4_);
    phone_00 = mk_phone_list(&local_70,(uint32 *)((long)&btw_mark + 4),ppcStack_50,phone._4_4_,
                             (lexicon_t *)mdef_local);
    seg_00 = puStack_40;
    n_frame_00 = word._4_4_;
    n_phone_00 = btw_mark._4_4_;
    paStack_60 = phone_00;
    if (phone_00 != (acmod_id_t *)0x0) break;
    pcVar2 = corpus_utt();
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/param_cnt/enum_corpus.c"
            ,0x7a,"Unable to produce phone sequence; skipping utt %s\n",pcVar2);
  }
  if (p_Stack_28 != phone_cnt) goto code_r0x001028a3;
  goto LAB_00102902;
code_r0x001028a3:
  acmod_set = *(acmod_set_t **)cnt_local;
  pcVar2 = corpus_utt();
  iVar1 = ck_seg(acmod_set,phone_00,n_phone_00,seg_00,n_frame_00,pcVar2);
  if (iVar1 == 0) {
LAB_00102902:
    (*p_Stack_28)((uint32 *)cnt_fn_local,(model_def_t *)cnt_local,puStack_40,word._4_4_,paStack_60,
                  local_70,btw_mark._4_4_);
  }
  goto LAB_001026aa;
}

Assistant:

int
enum_corpus(lexicon_t *lex,
	    model_def_t *mdef,
	    uint32 *cnt,
	    cnt_fn_t cnt_fn)
{
    uint32 tick_cnt = 0;
    char *trans = NULL;
    uint16 *seg = NULL;
    int32 n_frame;
    char **word = NULL;
    uint32 n_word;
    acmod_id_t *phone = NULL;
    uint32 n_phone;
    char *btw_mark = NULL;

    while (corpus_next_utt()) {
	if (trans) {
	    free(trans);
	    trans = NULL;
	}
	if (seg) {
	    free(seg);
	    seg = NULL;
	}
	if (word) {
	    ckd_free(word);
	    word = NULL;
	}
	if (phone) {
	    ckd_free(phone);
	    phone = NULL;
	}
	if (btw_mark) {
	    ckd_free(btw_mark);
	    btw_mark = NULL;
	}
	
	if ((++tick_cnt % 1000) == 0) {
	    fprintf(stderr, "[%u] ", tick_cnt);
	    fflush(stderr);
	}

	if (corpus_get_sent(&trans) != S3_SUCCESS) {
	    E_FATAL("Unable to read word transcript for %s\n", corpus_utt_brief_name());
	}

        if (cnt_fn != phone_cnt){
	    if (corpus_get_seg(&seg, &n_frame) != S3_SUCCESS) {
	        E_FATAL("Unable to read Viterbi state segmentation for %s\n",
		    corpus_utt_brief_name());
            }
	}
	    
	n_word = str2words(trans, NULL, 0);
	word = ckd_calloc(n_word, sizeof(char*));
	str2words(trans, word, n_word);

	phone = mk_phone_list(&btw_mark, &n_phone, word, n_word, lex);
	if (phone == NULL) {
	    E_WARN("Unable to produce phone sequence; skipping utt %s\n", corpus_utt());
	    continue;
	}

        if (cnt_fn != phone_cnt){
	    /* check to see whether the word transcript and dictionary entries
	       agree with the state segmentation */
	    if (ck_seg(mdef->acmod_set, phone, n_phone, seg, n_frame, corpus_utt()) != S3_SUCCESS) {
	        continue;
            }
	}

	(*cnt_fn)(cnt,				/* observation counts */
		  mdef,				/* model definitions */
		  seg, n_frame,			/* Viterbi state segmentation */
		  phone, btw_mark, n_phone);	/* list of phones */
    }

    /* free the per utterance data structures from the last utt */
    if (trans) {
	free(trans);
	trans = NULL;
    }
    if (seg) {
	free(seg);
	seg = NULL;
    }
    if (word) {
	ckd_free(word);
	word = NULL;
    }
    if (phone) {
	ckd_free(phone);
	phone = NULL;
    }
    if (btw_mark) {
	ckd_free(btw_mark);
	btw_mark = NULL;
    }
    
    return S3_SUCCESS;
}